

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_match_prefix(char *pattern,int pattern_len,char *str)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  int local_50;
  bool local_49;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int j;
  int i;
  int res;
  int len;
  char *or_str;
  char *str_local;
  int pattern_len_local;
  char *pattern_local;
  
  local_3c = 0;
  local_40 = 0;
  pvVar3 = memchr(pattern,0x7c,(long)pattern_len);
  if (pvVar3 == (void *)0x0) {
    for (; local_3c < pattern_len; local_3c = local_3c + 1) {
      if ((pattern[local_3c] != '?') || (str[local_40] == '\0')) {
        if (pattern[local_3c] == '$') {
          if (str[local_40] == '\0') {
            local_48 = local_40;
          }
          else {
            local_48 = -1;
          }
          return local_48;
        }
        if (pattern[local_3c] == '*') {
          if (pattern[local_3c + 1] == '*') {
            sVar4 = strlen(str + local_40);
            i = (int)sVar4;
            local_3c = local_3c + 2;
          }
          else {
            sVar4 = strcspn(str + local_40,"/");
            i = (int)sVar4;
            local_3c = local_3c + 1;
          }
          if (local_3c == pattern_len) {
            return local_40 + i;
          }
          do {
            iVar2 = i;
            iVar1 = mg_match_prefix(pattern + local_3c,pattern_len - local_3c,
                                    str + (long)i + (long)local_40);
            if (iVar1 == -1) {
              i = i + -1;
            }
            local_49 = iVar1 == -1 && 0 < iVar2;
          } while (local_49);
          if (iVar1 == -1) {
            local_50 = -1;
          }
          else {
            local_50 = local_40 + iVar1 + i;
          }
          return local_50;
        }
        iVar2 = lowercase(pattern + local_3c);
        iVar1 = lowercase(str + local_40);
        if (iVar2 != iVar1) {
          return -1;
        }
      }
      local_40 = local_40 + 1;
    }
    pattern_local._4_4_ = local_40;
  }
  else {
    local_44 = mg_match_prefix(pattern,(int)pvVar3 - (int)pattern,str);
    if (local_44 < 1) {
      local_44 = mg_match_prefix((char *)((long)pvVar3 + 1),
                                 ((int)pattern + pattern_len) - ((int)pvVar3 + 1),str);
    }
    pattern_local._4_4_ = local_44;
  }
  return pattern_local._4_4_;
}

Assistant:

int mg_match_prefix(const char *pattern, int pattern_len, const char *str) {
    const char *or_str;
    int len, res, i = 0, j = 0;

    if ((or_str = (const char *) memchr(pattern, '|', pattern_len)) != NULL) {
        res = mg_match_prefix(pattern, or_str - pattern, str);
        return res > 0 ? res : mg_match_prefix(
                or_str + 1,
                (pattern + pattern_len) - (or_str + 1), str);
    }

    for (; i < pattern_len; i++, j++) {
        if (pattern[i] == '?' && str[j] != '\0') {
            continue;
        } else if (pattern[i] == '$') {
            return str[j] == '\0' ? j : -1;
        } else if (pattern[i] == '*') {
            i++;
            if (pattern[i] == '*') {
                i++;
                len = (int) strlen(str + j);
            } else {
                len = (int) strcspn(str + j, "/");
            }
            if (i == pattern_len) {
                return j + len;
            }
            do {
                res = mg_match_prefix(pattern + i, pattern_len - i, str + j + len);
            } while (res == -1 && len-- > 0);
            return res == -1 ? -1 : j + res + len;
        } else if (lowercase(&pattern[i]) != lowercase(&str[j])) {
            return -1;
        }
    }
    return j;
}